

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall asl::InetAddress::port(InetAddress *this)

{
  uint16_t uVar1;
  byte *pbVar2;
  sockaddr_in *addr_1;
  sockaddr_in6 *addr;
  InetAddress *this_local;
  
  if (this->_type == IPv6) {
    pbVar2 = ptr(this);
    uVar1 = ntohs(*(uint16_t *)(pbVar2 + 2));
    this_local._4_4_ = (uint)uVar1;
  }
  else if (this->_type == IPv4) {
    pbVar2 = ptr(this);
    uVar1 = ntohs(*(uint16_t *)(pbVar2 + 2));
    this_local._4_4_ = (uint)uVar1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int InetAddress::port() const
{
	if (_type == IPv6)
	{
		sockaddr_in6* addr = (sockaddr_in6*)ptr();
		return ntohs(addr->sin6_port);
	}
	else if (_type == IPv4)
	{
		sockaddr_in* addr = (sockaddr_in*)ptr();
		return ntohs(addr->sin_port);
	}
	return 0;
}